

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall boost::filesystem::path::m_erase_redundant_separator(path *this,size_type sep_pos)

{
  if (((sep_pos != 0) && (sep_pos < (this->m_pathname)._M_string_length)) &&
     ((this->m_pathname)._M_dataplus._M_p[sep_pos + 1] == '/')) {
    std::__cxx11::string::erase((ulong)this,sep_pos);
    return;
  }
  return;
}

Assistant:

void path::m_erase_redundant_separator(string_type::size_type sep_pos)
  {
    if (sep_pos                         // a separator was added
      && sep_pos < m_pathname.size()         // and something was appended
      && (m_pathname[sep_pos+1] == separator // and it was also separator
#      ifdef BOOST_WINDOWS_API
       || m_pathname[sep_pos+1] == preferred_separator  // or preferred_separator
#      endif
)) { m_pathname.erase(sep_pos, 1); } // erase the added separator
  }